

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

void crypto::xchacha20::derive_subkey(char *key,char *nonce,char *subkey)

{
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_28;
  undefined8 uStack_20;
  
  init_state((word *)&local_58,key);
  local_28 = *(undefined8 *)nonce;
  uStack_20 = *(undefined8 *)(nonce + 8);
  run_rounds((word *)&local_58);
  *(undefined8 *)subkey = local_58;
  *(undefined8 *)(subkey + 8) = uStack_50;
  *(undefined8 *)(subkey + 0x10) = local_28;
  *(undefined8 *)(subkey + 0x18) = uStack_20;
  return;
}

Assistant:

void xchacha20::derive_subkey(const char key[key_size], const char nonce[16], char subkey[key_size]) {
	
	word state[16];
	init_state(state, key);
	state[12] = util::little_endian::load<word>(nonce);
	state[13] = util::little_endian::load<word>(nonce + 4);
	state[14] = util::little_endian::load<word>(nonce + 8);
	state[15] = util::little_endian::load<word>(nonce + 12);
	run_rounds(state);
	util::little_endian::store<word>(state[0], subkey);
	util::little_endian::store<word>(state[1], subkey + 4);
	util::little_endian::store<word>(state[2], subkey + 8);
	util::little_endian::store<word>(state[3], subkey + 12);
	util::little_endian::store<word>(state[12], subkey + 16);
	util::little_endian::store<word>(state[13], subkey + 20);
	util::little_endian::store<word>(state[14], subkey + 24);
	util::little_endian::store<word>(state[15], subkey + 28);
	
}